

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

uint8 * google::protobuf::internal::PrimitiveTypeHelper<17>::SerializeToArray
                  (void *ptr,uint8 *buffer)

{
  uint32 value;
  int *piVar1;
  uint8 *puVar2;
  uint8 *buffer_local;
  void *ptr_local;
  
  piVar1 = Get<int>(ptr);
  value = WireFormatLite::ZigZagEncode32(*piVar1);
  puVar2 = io::CodedOutputStream::WriteVarint32ToArray(value,buffer);
  return puVar2;
}

Assistant:

static uint8* SerializeToArray(const void* ptr, uint8* buffer) {
    return WireFormatLite::WriteSInt32NoTagToArray(Get<Type>(ptr), buffer);
  }